

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O2

bool __thiscall InterCode::doArith(InterCode *this)

{
  Operand *this_00;
  int iVar1;
  bool bVar2;
  bool bVar3;
  int a1;
  int a2;
  int local_60;
  int local_5c;
  undefined1 local_58 [48];
  
  if (3 < this->kind - 1U) {
    return false;
  }
  local_60 = 0;
  local_5c = 0;
  this_00 = &this->arg1;
  bVar2 = Operand::getInt(this_00,&local_60);
  bVar3 = Operand::getInt(&this->arg2,&local_5c);
  iVar1 = this->kind;
  if (iVar1 != 2 || (this->arg2).kind != 0) {
    if (!bVar2 || !bVar3) {
      if (!bVar2 && !bVar3) {
        return false;
      }
      if (bVar2 && local_60 == 0) {
        if (1 < iVar1 - 3U) {
          if (iVar1 != 1) {
            return false;
          }
          this->kind = 5;
          Operand::operator=(this_00,&this->arg2);
LAB_00108e17:
          (this->arg2).kind = 0;
          (this->arg2).value._M_string_length = 0;
          *(this->arg2).value._M_dataplus._M_p = '\0';
          return false;
        }
      }
      else {
        if (!bVar3 || local_5c != 0) {
          return false;
        }
        if (iVar1 - 1U < 2) {
          this->kind = 5;
          goto LAB_00108e17;
        }
        if (iVar1 != 3) {
          return false;
        }
      }
      this->kind = 5;
      (this->arg2).kind = 0;
      (this->arg2).value._M_string_length = 0;
      *(this->arg2).value._M_dataplus._M_p = '\0';
      Operand::operator=(this_00,&OP_ZERO);
      return false;
    }
    if (iVar1 == 3) {
      local_60 = local_60 * local_5c;
    }
    else if (iVar1 == 2) {
      local_60 = local_60 - local_5c;
    }
    else if (iVar1 == 1) {
      local_60 = local_60 + local_5c;
    }
    else {
      local_60 = local_60 / local_5c;
    }
    (this->arg2).kind = 0;
    (this->arg2).value._M_string_length = 0;
    *(this->arg2).value._M_dataplus._M_p = '\0';
    Operand::Operand((Operand *)local_58,local_60);
    Operand::operator=(this_00,(Operand *)local_58);
    std::__cxx11::string::~string((string *)(local_58 + 8));
  }
  this->kind = 5;
  return true;
}

Assistant:

bool InterCode::doArith() {
    if (kind >= IC_ADD && kind <= IC_DIV) {
        int a1 = 0, a2 = 0;
        bool isA1 = arg1.getInt(a1), isA2 = arg2.getInt(a2);
        if (arg2.kind == IR_NONE && kind == IC_SUB) {
            a1 = -a1;
            kind = IC_ASSIGN;
            return true;
        }
        else if (isA1 && isA2) {
            switch (kind) {
                case IC_ADD: a1 += a2; break;
                case IC_SUB: a1 -= a2; break;
                case IC_MUL: a1 *= a2; break;
                default:     a1 /= a2;
            }
            arg2.clear();
            arg1 = Operand(a1);
            kind = IC_ASSIGN;
            return true;
        }
        else if (isA1 || isA2) {
            if (isA1 && a1 == 0) {
                if (kind == IC_MUL || kind == IC_DIV) {
                    kind = IC_ASSIGN;
                    arg2.clear();
                    arg1 = OP_ZERO;
                }
                else if (kind == IC_ADD) {
                    kind = IC_ASSIGN;
                    arg1 = arg2;
                    arg2.clear();
                }
            }
            else if (isA2 && a2 == 0) {
                if (kind == IC_MUL) {
                    kind = IC_ASSIGN;
                    arg2.clear();
                    arg1 = OP_ZERO;
                }
                else if (kind == IC_ADD || kind == IC_SUB) {
                    kind = IC_ASSIGN;
                    arg2.clear();
                }
            }
        }
    }
    return false;
}